

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

int update_multiple_arg_temp
              (generic_list **list,uint *prev_given,char *val,char **possible_values,
              char *default_value,cmdline_parser_arg_type arg_type,char *long_opt,char short_opt,
              char *additional_error)

{
  char **in_RCX;
  char *in_RDX;
  void *unaff_RBX;
  uint *in_RSI;
  uint *in_RDI;
  char *in_R8;
  int in_R9D;
  char *unaff_retaddr;
  cmdline_parser_arg_type in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  char *in_stack_00000030;
  char in_stack_00000038;
  char *in_stack_00000040;
  char *multi_next;
  char *multi_token;
  char *in_stack_ffffffffffffff58;
  char *arg;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff88;
  char *arg_00;
  char *local_60;
  char *local_58;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  
  if (in_R9D == 0) {
    *in_RSI = *in_RSI + 1;
    iVar1 = 0;
  }
  else {
    local_58 = get_multiple_arg_token(in_stack_ffffffffffffff88);
    local_60 = get_multiple_arg_token_next(in_stack_ffffffffffffff58);
    while( true ) {
      add_node((generic_list **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      arg_00 = (char *)CONCAT44(in_stack_0000000c,in_stack_00000008);
      arg = in_R8;
      in_stack_ffffffffffffff60 = in_R9D;
      iVar1 = update_arg(unaff_RBX,
                         (char **)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         in_RDI,in_RSI,in_RDX,in_RCX,unaff_retaddr,in_stack_00000008,
                         in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
                         in_stack_00000030,in_stack_00000038,in_stack_00000040);
      if (iVar1 != 0) break;
      if (local_60 == (char *)0x0) {
        return 0;
      }
      local_58 = get_multiple_arg_token(arg_00);
      local_60 = get_multiple_arg_token_next(arg);
    }
    if (local_58 != (char *)0x0) {
      free(local_58);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static
int update_multiple_arg_temp(struct generic_list **list,
               unsigned int *prev_given, const char *val,
               const char *possible_values[], const char *default_value,
               cmdline_parser_arg_type arg_type,
               const char *long_opt, char short_opt,
               const char *additional_error)
{
  /* store single arguments */
  char *multi_token;
  const char *multi_next;

  if (arg_type == ARG_NO) {
    (*prev_given)++;
    return 0; /* OK */
  }

  multi_token = get_multiple_arg_token(val);
  multi_next = get_multiple_arg_token_next (val);

  while (1)
    {
      add_node (list);
      if (update_arg((void *)&((*list)->arg), &((*list)->orig), 0,
          prev_given, multi_token, possible_values, default_value, 
          arg_type, 0, 1, 1, 1, long_opt, short_opt, additional_error)) {
        if (multi_token) free(multi_token);
        return 1; /* failure */
      }

      if (multi_next)
        {
          multi_token = get_multiple_arg_token(multi_next);
          multi_next = get_multiple_arg_token_next (multi_next);
        }
      else
        break;
    }

  return 0; /* OK */
}